

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3WhereEnd(WhereInfo *pWInfo)

{
  Op *pOVar1;
  byte bVar2;
  u8 uVar3;
  int iVar4;
  Parse *pParse;
  SrcList *pTabList;
  sqlite3 *db;
  Vdbe *v;
  WhereRightJoin *pWVar5;
  WhereLoop *pWVar6;
  Schema *pSVar7;
  Table *pTVar8;
  bool bVar9;
  char cVar10;
  ushort uVar11;
  int iVar12;
  anon_union_16_2_b76807be_for_u *paVar13;
  ulong uVar14;
  Op *pOVar15;
  Schema **ppSVar16;
  IndexedExpr *pIVar17;
  long lVar18;
  u16 *puVar19;
  Index *pIVar20;
  int p1;
  WhereRightJoin *pRJ;
  u8 *puVar21;
  WhereLevel *pWVar22;
  int op;
  ulong uVar23;
  uint uVar24;
  Index *pIVar25;
  uint uVar26;
  int iVar27;
  char local_64;
  
  pParse = pWInfo->pParse;
  pTabList = pWInfo->pTabList;
  db = pParse->db;
  v = pParse->pVdbe;
  iVar4 = v->nOp;
  uVar14 = (ulong)pWInfo->nLevel;
  local_64 = '\0';
  cVar10 = '\0';
  if (uVar14 != 0) {
    do {
      local_64 = cVar10;
      pWVar22 = pWInfo->a + (uVar14 - 1);
      pWVar5 = pWInfo->a[uVar14 - 1].pRJ;
      if (pWVar5 != (WhereRightJoin *)0x0) {
        sqlite3VdbeResolveLabel(v,pWVar22->addrCont);
        pWVar22->addrCont = 0;
        pWVar5->endSubrtn = v->nOp;
        sqlite3VdbeAddOp3(v,0x43,pWVar5->regReturn,pWVar5->addrSubrtn,1);
        local_64 = local_64 + '\x01';
      }
      pWVar6 = pWVar22->pWLoop;
      if (pWVar22->op == 0xbb) {
        if (pWVar22->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar22->addrCont);
        }
      }
      else {
        iVar12 = 0;
        iVar27 = 0;
        if ((((pWInfo->eDistinct == '\x02') && (uVar14 == pWInfo->nLevel)) &&
            ((pWVar6->wsFlags & 0x200) != 0)) &&
           (pIVar25 = (pWVar6->u).btree.pIndex, iVar12 = iVar27, (pIVar25->field_0x63 & 0x80) != 0))
        {
          uVar11 = (pWVar6->u).btree.nDistinctCol;
          if ((uVar11 != 0) && (uVar24 = (uint)uVar11, 0x23 < pIVar25->aiRowLogEst[uVar11])) {
            iVar12 = pParse->nMem + 1;
            uVar26 = 0;
            do {
              sqlite3VdbeAddOp3(v,0x5e,pWVar22->iIdxCur,uVar26,iVar12 + uVar26);
              uVar26 = uVar26 + 1;
            } while (uVar24 != uVar26);
            pParse->nMem = pParse->nMem + uVar24 + 1;
            iVar12 = sqlite3VdbeAddOp4Int
                               (v,(uint)(pWVar22->op != '&') * 3 + 0x15,pWVar22->iIdxCur,0,iVar12,
                                uVar24);
            sqlite3VdbeAddOp3(v,9,1,pWVar22->p2,0);
          }
        }
        if (pWVar22->addrCont != 0) {
          sqlite3VdbeResolveLabel(v,pWVar22->addrCont);
        }
        sqlite3VdbeAddOp3(v,(uint)pWVar22->op,pWVar22->p1,pWVar22->p2,(uint)pWVar22->p3);
        if (0 < (long)v->nOp) {
          v->aOp[(long)v->nOp + -1].p5 = (ushort)pWVar22->p5;
        }
        if (pWVar22->regBignull != 0) {
          sqlite3VdbeResolveLabel(v,pWVar22->addrBignull);
          sqlite3VdbeAddOp3(v,0x3d,pWVar22->regBignull,pWVar22->p2 + -1,0);
        }
        if (iVar12 != 0) {
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (v->db->mallocFailed == '\0') {
            pOVar15 = v->aOp + iVar12;
          }
          pOVar15->p2 = v->nOp;
        }
      }
      if (((pWVar6->wsFlags & 0x800) != 0) && (0 < (pWVar22->u).in.nIn)) {
        sqlite3VdbeResolveLabel(v,pWVar22->addrNxt);
        iVar12 = (pWVar22->u).in.nIn;
        if (0 < (long)iVar12) {
          iVar27 = iVar12 + 1;
          puVar21 = &(pWVar22->u).in.aInLoop[(long)iVar12 + -1].eEndLoopOp;
          do {
            pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (v->db->mallocFailed == '\0') {
              pOVar15 = v->aOp + (long)*(int *)(puVar21 + -0xc) + 1;
            }
            iVar12 = v->nOp;
            pOVar15->p2 = iVar12;
            if (*puVar21 != 0xbb) {
              if (*(int *)(puVar21 + -4) != 0) {
                uVar24 = pWVar6->wsFlags & 0x40400;
                if (pWVar22->iLeftJoin != 0) {
                  sqlite3VdbeAddOp3(v,0x19,((InLoop *)(puVar21 + -0x10))->iCur,
                                    (uint)(uVar24 == 0x40000) + iVar12 + 2,0);
                }
                if (uVar24 == 0x40000) {
                  sqlite3VdbeAddOp4Int
                            (v,0x1a,pWVar22->iIdxCur,v->nOp + 2,*(int *)(puVar21 + -8),
                             *(int *)(puVar21 + -4));
                  pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
                  if (v->db->mallocFailed == '\0') {
                    pOVar15 = v->aOp + (long)*(int *)(puVar21 + -0xc) + 1;
                  }
                  pOVar15->p2 = v->nOp;
                }
              }
              sqlite3VdbeAddOp3(v,(uint)*puVar21,((InLoop *)(puVar21 + -0x10))->iCur,
                                *(int *)(puVar21 + -0xc),0);
            }
            pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (v->db->mallocFailed == '\0') {
              pOVar15 = v->aOp + (long)*(int *)(puVar21 + -0xc) + -1;
            }
            pOVar15->p2 = v->nOp;
            iVar27 = iVar27 + -1;
            puVar21 = puVar21 + -0x14;
          } while (1 < iVar27);
        }
      }
      sqlite3VdbeResolveLabel(v,pWVar22->addrBrk);
      if (pWVar22->pRJ != (WhereRightJoin *)0x0) {
        sqlite3VdbeAddOp3(v,0x43,pWVar22->pRJ->regReturn,0,1);
      }
      if (pWVar22->addrSkip != 0) {
        sqlite3VdbeAddOp3(v,9,0,pWVar22->addrSkip,0);
        iVar12 = v->nOp;
        if (v->db->mallocFailed == '\0') {
          pOVar15 = v->aOp + (long)pWVar22->addrSkip + -2;
          v->aOp[pWVar22->addrSkip].p2 = iVar12;
        }
        else {
          pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
          DAT_00244348 = iVar12;
        }
        pOVar15->p2 = iVar12;
      }
      if (pWVar22->addrLikeRep != 0) {
        sqlite3VdbeAddOp3(v,0x3d,pWVar22->iLikeRepCntr >> 1,pWVar22->addrLikeRep,0);
      }
      if (pWVar22->iLeftJoin != 0) {
        uVar24 = pWVar6->wsFlags;
        iVar12 = sqlite3VdbeAddOp3(v,0x32,pWVar22->iLeftJoin,0,0);
        if ((uVar24 & 0x40) == 0) {
          bVar2 = pWVar22->iFrom;
          if ((pTabList->a[bVar2].fg.field_0x1 & 0x40) != 0) {
            iVar27 = (pTabList->a[bVar2].u4.pSubq)->regResult;
            sqlite3VdbeAddOp3(v,0x4b,0,iVar27,iVar27 + (pTabList->a[bVar2].pSTab)->nCol + -1);
          }
          sqlite3VdbeAddOp3(v,0x88,pWVar22->iTabCur,0,0);
        }
        if (((uVar24 >> 9 & 1) != 0) ||
           (((uVar24 >> 0xd & 1) != 0 && ((pWVar22->u).pCoveringIdx != (Index *)0x0)))) {
          if ((uVar24 >> 0xd & 1) != 0) {
            pIVar25 = (pWVar22->u).pCoveringIdx;
            if (pIVar25->pSchema == (Schema *)0x0) {
              iVar27 = -0x8000;
            }
            else {
              iVar27 = -1;
              ppSVar16 = &db->aDb->pSchema;
              do {
                iVar27 = iVar27 + 1;
                pSVar7 = *ppSVar16;
                ppSVar16 = ppSVar16 + 4;
              } while (pSVar7 != pIVar25->pSchema);
            }
            sqlite3VdbeAddOp3(v,0x65,pWVar22->iIdxCur,pIVar25->tnum,iVar27);
            sqlite3VdbeSetP4KeyInfo(pParse,pIVar25);
          }
          sqlite3VdbeAddOp3(v,0x88,pWVar22->iIdxCur,0,0);
        }
        if (pWVar22->op == 'C') {
          iVar27 = pWVar22->addrFirst;
          p1 = pWVar22->p1;
          op = 10;
        }
        else {
          iVar27 = pWVar22->addrFirst;
          op = 9;
          p1 = 0;
        }
        sqlite3VdbeAddOp3(v,op,p1,iVar27,0);
        pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (v->db->mallocFailed == '\0') {
          pOVar15 = v->aOp + iVar12;
        }
        pOVar15->p2 = v->nOp;
      }
      bVar9 = 1 < (long)uVar14;
      uVar14 = uVar14 - 1;
      cVar10 = local_64;
    } while (bVar9);
  }
  if (pWInfo->nLevel != '\0') {
    pWVar22 = pWInfo->a;
    uVar24 = 0;
    do {
      if (pWVar22->pRJ == (WhereRightJoin *)0x0) {
        bVar2 = pWVar22->iFrom;
        if ((pTabList->a[bVar2].fg.field_0x1 & 0x40) == 0) {
          pWVar6 = pWVar22->pWLoop;
          if ((pWVar6->wsFlags & 0x240) == 0) {
            if ((pWVar6->wsFlags >> 0xd & 1) != 0) {
              paVar13 = &pWVar22->u;
              goto LAB_001904b5;
            }
            pIVar25 = (Index *)0x0;
          }
          else {
            paVar13 = (anon_union_16_2_b76807be_for_u *)&(pWVar6->u).btree.pIndex;
LAB_001904b5:
            pIVar25 = paVar13->pCoveringIdx;
          }
          if ((pIVar25 != (Index *)0x0) && (db->mallocFailed == '\0')) {
            iVar12 = iVar4;
            if ((pWInfo->eOnePass != '\0') && ((pIVar25->pTable->tabFlags & 0x80) == 0)) {
              iVar12 = pWInfo->iEndWhere;
            }
            pTVar8 = pTabList->a[bVar2].pSTab;
            if (((pIVar25->field_0x64 & 0x10) != 0) &&
               (pIVar17 = pParse->pIdxEpr, pIVar17 != (IndexedExpr *)0x0)) {
              iVar27 = pWVar22->iIdxCur;
              do {
                if (pIVar17->iIdxCur == iVar27) {
                  pIVar17->iDataCur = -1;
                  pIVar17->iIdxCur = -1;
                }
                pIVar17 = pIVar17->pIENext;
              } while (pIVar17 != (IndexedExpr *)0x0);
            }
            lVar18 = (long)pWVar22->addrBody + 1;
            pOVar15 = (Op *)&sqlite3VdbeGetOp_dummy;
            if (v->db->mallocFailed == '\0') {
              pOVar15 = v->aOp + lVar18;
            }
            pOVar1 = pOVar15 + (iVar12 - (int)lVar18);
            do {
              if (pOVar15->p1 == pWVar22->iTabCur) {
                uVar3 = pOVar15->opcode;
                if (uVar3 == '\x14') {
LAB_00190642:
                  pOVar15->p1 = pWVar22->iIdxCur;
                }
                else if (uVar3 == 0x87) {
                  pOVar15->p1 = pWVar22->iIdxCur;
                  pOVar15->opcode = 0x8e;
                }
                else if (uVar3 == '^') {
                  uVar14 = (ulong)pOVar15->p2;
                  if ((char)pTVar8->tabFlags < '\0') {
                    for (pIVar20 = pTVar8->pIndex;
                        (pIVar20 != (Index *)0x0 && ((*(ushort *)&pIVar20->field_0x63 & 3) != 2));
                        pIVar20 = pIVar20->pNext) {
                    }
                    uVar14 = (ulong)(ushort)pIVar20->aiColumn[uVar14];
                  }
                  else if ((-1 < (short)pOVar15->p2) && ((pTVar8->tabFlags & 0x20) != 0)) {
                    puVar19 = &pTVar8->aCol->colFlags;
                    lVar18 = -1;
                    do {
                      uVar11 = (short)uVar14 + (ushort)((*puVar19 >> 5 & 1) != 0);
                      uVar14 = (ulong)uVar11;
                      lVar18 = lVar18 + 1;
                      puVar19 = puVar19 + 8;
                    } while (lVar18 < (short)uVar11);
                  }
                  uVar26 = 0xffff;
                  if ((ulong)pIVar25->nColumn != 0) {
                    uVar23 = 0;
                    do {
                      if (pIVar25->aiColumn[uVar23] == (short)uVar14) {
                        uVar26 = (uint)uVar23;
                        break;
                      }
                      uVar23 = uVar23 + 1;
                    } while (pIVar25->nColumn != uVar23);
                  }
                  if (-1 < (short)uVar26) {
                    pOVar15->p2 = uVar26 & 0xffff;
                    goto LAB_00190642;
                  }
                  uVar26 = pWVar6->wsFlags;
                  if ((uVar26 & 0x4000040) != 0) {
                    if ((uVar26 & 0x40) == 0) {
                      pWVar6->wsFlags = uVar26 & 0xfbffffbf;
                      sqlite3WhereAddExplainText
                                (pParse,pWVar22->addrBody + -1,pTabList,pWVar22,pWInfo->wctrlFlags);
                    }
                    else {
                      sqlite3ErrorMsg(pParse,"internal query planner error");
                      pParse->rc = 2;
                    }
                  }
                }
              }
              pOVar15 = pOVar15 + 1;
            } while (pOVar15 < pOVar1);
          }
        }
        else {
          translateColumnToCopy
                    (pParse,pWVar22->addrBody,pWVar22->iTabCur,
                     (pTabList->a[bVar2].u4.pSubq)->regResult,0);
        }
      }
      else {
        sqlite3WhereRightJoinLoop(pWInfo,uVar24,pWVar22);
      }
      uVar24 = uVar24 + 1;
      pWVar22 = pWVar22 + 1;
    } while (uVar24 < pWInfo->nLevel);
  }
  sqlite3VdbeResolveLabel(v,pWInfo->iBreak);
  pParse->nQueryLoop = (LogEst)pWInfo->savedNQueryLoop;
  whereInfoFree(db,pWInfo);
  pParse->withinRJSubrtn = pParse->withinRJSubrtn - local_64;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereEnd(WhereInfo *pWInfo){
  Parse *pParse = pWInfo->pParse;
  Vdbe *v = pParse->pVdbe;
  int i;
  WhereLevel *pLevel;
  WhereLoop *pLoop;
  SrcList *pTabList = pWInfo->pTabList;
  sqlite3 *db = pParse->db;
  int iEnd = sqlite3VdbeCurrentAddr(v);
  int nRJ = 0;

  /* Generate loop termination code.
  */
  VdbeModuleComment((v, "End WHERE-core"));
  for(i=pWInfo->nLevel-1; i>=0; i--){
    int addr;
    pLevel = &pWInfo->a[i];
    if( pLevel->pRJ ){
      /* Terminate the subroutine that forms the interior of the loop of
      ** the RIGHT JOIN table */
      WhereRightJoin *pRJ = pLevel->pRJ;
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      pLevel->addrCont = 0;
      pRJ->endSubrtn = sqlite3VdbeCurrentAddr(v);
      sqlite3VdbeAddOp3(v, OP_Return, pRJ->regReturn, pRJ->addrSubrtn, 1);
      VdbeCoverage(v);
      nRJ++;
    }
    pLoop = pLevel->pWLoop;
    if( pLevel->op!=OP_Noop ){
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      int addrSeek = 0;
      Index *pIdx;
      int n;
      if( pWInfo->eDistinct==WHERE_DISTINCT_ORDERED
       && i==pWInfo->nLevel-1  /* Ticket [ef9318757b152e3] 2017-10-21 */
       && (pLoop->wsFlags & WHERE_INDEXED)!=0
       && (pIdx = pLoop->u.btree.pIndex)->hasStat1
       && (n = pLoop->u.btree.nDistinctCol)>0
       && pIdx->aiRowLogEst[n]>=36
      ){
        int r1 = pParse->nMem+1;
        int j, op;
        for(j=0; j<n; j++){
          sqlite3VdbeAddOp3(v, OP_Column, pLevel->iIdxCur, j, r1+j);
        }
        pParse->nMem += n+1;
        op = pLevel->op==OP_Prev ? OP_SeekLT : OP_SeekGT;
        addrSeek = sqlite3VdbeAddOp4Int(v, op, pLevel->iIdxCur, 0, r1, n);
        VdbeCoverageIf(v, op==OP_SeekLT);
        VdbeCoverageIf(v, op==OP_SeekGT);
        sqlite3VdbeAddOp2(v, OP_Goto, 1, pLevel->p2);
      }
#endif /* SQLITE_DISABLE_SKIPAHEAD_DISTINCT */
      /* The common case: Advance to the next row */
      if( pLevel->addrCont ) sqlite3VdbeResolveLabel(v, pLevel->addrCont);
      sqlite3VdbeAddOp3(v, pLevel->op, pLevel->p1, pLevel->p2, pLevel->p3);
      sqlite3VdbeChangeP5(v, pLevel->p5);
      VdbeCoverage(v);
      VdbeCoverageIf(v, pLevel->op==OP_Next);
      VdbeCoverageIf(v, pLevel->op==OP_Prev);
      VdbeCoverageIf(v, pLevel->op==OP_VNext);
      if( pLevel->regBignull ){
        sqlite3VdbeResolveLabel(v, pLevel->addrBignull);
        sqlite3VdbeAddOp2(v, OP_DecrJumpZero, pLevel->regBignull, pLevel->p2-1);
        VdbeCoverage(v);
      }
#ifndef SQLITE_DISABLE_SKIPAHEAD_DISTINCT
      if( addrSeek ) sqlite3VdbeJumpHere(v, addrSeek);
#endif
    }else if( pLevel->addrCont ){
      sqlite3VdbeResolveLabel(v, pLevel->addrCont);
    }
    if( (pLoop->wsFlags & WHERE_IN_ABLE)!=0 && pLevel->u.in.nIn>0 ){
      struct InLoop *pIn;
      int j;
      sqlite3VdbeResolveLabel(v, pLevel->addrNxt);
      for(j=pLevel->u.in.nIn, pIn=&pLevel->u.in.aInLoop[j-1]; j>0; j--, pIn--){
        assert( sqlite3VdbeGetOp(v, pIn->addrInTop+1)->opcode==OP_IsNull
                 || pParse->db->mallocFailed );
        sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
        if( pIn->eEndLoopOp!=OP_Noop ){
          if( pIn->nPrefix ){
            int bEarlyOut =
                (pLoop->wsFlags & WHERE_VIRTUALTABLE)==0
                 && (pLoop->wsFlags & WHERE_IN_EARLYOUT)!=0;
            if( pLevel->iLeftJoin ){
              /* For LEFT JOIN queries, cursor pIn->iCur may not have been
              ** opened yet. This occurs for WHERE clauses such as
              ** "a = ? AND b IN (...)", where the index is on (a, b). If
              ** the RHS of the (a=?) is NULL, then the "b IN (...)" may
              ** never have been coded, but the body of the loop run to
              ** return the null-row. So, if the cursor is not open yet,
              ** jump over the OP_Next or OP_Prev instruction about to
              ** be coded.  */
              sqlite3VdbeAddOp2(v, OP_IfNotOpen, pIn->iCur,
                  sqlite3VdbeCurrentAddr(v) + 2 + bEarlyOut);
              VdbeCoverage(v);
            }
            if( bEarlyOut ){
              sqlite3VdbeAddOp4Int(v, OP_IfNoHope, pLevel->iIdxCur,
                  sqlite3VdbeCurrentAddr(v)+2,
                  pIn->iBase, pIn->nPrefix);
              VdbeCoverage(v);
              /* Retarget the OP_IsNull against the left operand of IN so
              ** it jumps past the OP_IfNoHope.  This is because the
              ** OP_IsNull also bypasses the OP_Affinity opcode that is
              ** required by OP_IfNoHope. */
              sqlite3VdbeJumpHere(v, pIn->addrInTop+1);
            }
          }
          sqlite3VdbeAddOp2(v, pIn->eEndLoopOp, pIn->iCur, pIn->addrInTop);
          VdbeCoverage(v);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Prev);
          VdbeCoverageIf(v, pIn->eEndLoopOp==OP_Next);
        }
        sqlite3VdbeJumpHere(v, pIn->addrInTop-1);
      }
    }
    sqlite3VdbeResolveLabel(v, pLevel->addrBrk);
    if( pLevel->pRJ ){
      sqlite3VdbeAddOp3(v, OP_Return, pLevel->pRJ->regReturn, 0, 1);
      VdbeCoverage(v);
    }
    if( pLevel->addrSkip ){
      sqlite3VdbeGoto(v, pLevel->addrSkip);
      VdbeComment((v, "next skip-scan on %s", pLoop->u.btree.pIndex->zName));
      sqlite3VdbeJumpHere(v, pLevel->addrSkip);
      sqlite3VdbeJumpHere(v, pLevel->addrSkip-2);
    }
#ifndef SQLITE_LIKE_DOESNT_MATCH_BLOBS
    if( pLevel->addrLikeRep ){
      sqlite3VdbeAddOp2(v, OP_DecrJumpZero, (int)(pLevel->iLikeRepCntr>>1),
                        pLevel->addrLikeRep);
      VdbeCoverage(v);
    }
#endif
    if( pLevel->iLeftJoin ){
      int ws = pLoop->wsFlags;
      addr = sqlite3VdbeAddOp1(v, OP_IfPos, pLevel->iLeftJoin); VdbeCoverage(v);
      assert( (ws & WHERE_IDX_ONLY)==0 || (ws & WHERE_INDEXED)!=0 );
      if( (ws & WHERE_IDX_ONLY)==0 ){
        SrcItem *pSrc = &pTabList->a[pLevel->iFrom];
        assert( pLevel->iTabCur==pSrc->iCursor );
        if( pSrc->fg.viaCoroutine ){
          int m, n;
          assert( pSrc->fg.isSubquery );
          n = pSrc->u4.pSubq->regResult;
          assert( pSrc->pSTab!=0 );
          m = pSrc->pSTab->nCol;
          sqlite3VdbeAddOp3(v, OP_Null, 0, n, n+m-1);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iTabCur);
      }
      if( (ws & WHERE_INDEXED)
       || ((ws & WHERE_MULTI_OR) && pLevel->u.pCoveringIdx)
      ){
        if( ws & WHERE_MULTI_OR ){
          Index *pIx = pLevel->u.pCoveringIdx;
          int iDb = sqlite3SchemaToIndex(db, pIx->pSchema);
          sqlite3VdbeAddOp3(v, OP_ReopenIdx, pLevel->iIdxCur, pIx->tnum, iDb);
          sqlite3VdbeSetP4KeyInfo(pParse, pIx);
        }
        sqlite3VdbeAddOp1(v, OP_NullRow, pLevel->iIdxCur);
      }
      if( pLevel->op==OP_Return ){
        sqlite3VdbeAddOp2(v, OP_Gosub, pLevel->p1, pLevel->addrFirst);
      }else{
        sqlite3VdbeGoto(v, pLevel->addrFirst);
      }
      sqlite3VdbeJumpHere(v, addr);
    }
    VdbeModuleComment((v, "End WHERE-loop%d: %s", i,
                     pWInfo->pTabList->a[pLevel->iFrom].pSTab->zName));
  }

  assert( pWInfo->nLevel<=pTabList->nSrc );
  for(i=0, pLevel=pWInfo->a; i<pWInfo->nLevel; i++, pLevel++){
    int k, last;
    VdbeOp *pOp, *pLastOp;
    Index *pIdx = 0;
    SrcItem *pTabItem = &pTabList->a[pLevel->iFrom];
    Table *pTab = pTabItem->pSTab;
    assert( pTab!=0 );
    pLoop = pLevel->pWLoop;

    /* Do RIGHT JOIN processing.  Generate code that will output the
    ** unmatched rows of the right operand of the RIGHT JOIN with
    ** all of the columns of the left operand set to NULL.
    */
    if( pLevel->pRJ ){
      sqlite3WhereRightJoinLoop(pWInfo, i, pLevel);
      continue;
    }

    /* For a co-routine, change all OP_Column references to the table of
    ** the co-routine into OP_Copy of result contained in a register.
    ** OP_Rowid becomes OP_Null.
    */
    if( pTabItem->fg.viaCoroutine ){
      testcase( pParse->db->mallocFailed );
      assert( pTabItem->fg.isSubquery );
      assert( pTabItem->u4.pSubq->regResult>=0 );
      translateColumnToCopy(pParse, pLevel->addrBody, pLevel->iTabCur,
                            pTabItem->u4.pSubq->regResult, 0);
      continue;
    }

    /* If this scan uses an index, make VDBE code substitutions to read data
    ** from the index instead of from the table where possible.  In some cases
    ** this optimization prevents the table from ever being read, which can
    ** yield a significant performance boost.
    **
    ** Calls to the code generator in between sqlite3WhereBegin and
    ** sqlite3WhereEnd will have created code that references the table
    ** directly.  This loop scans all that code looking for opcodes
    ** that reference the table and converts them into opcodes that
    ** reference the index.
    */
    if( pLoop->wsFlags & (WHERE_INDEXED|WHERE_IDX_ONLY) ){
      pIdx = pLoop->u.btree.pIndex;
    }else if( pLoop->wsFlags & WHERE_MULTI_OR ){
      pIdx = pLevel->u.pCoveringIdx;
    }
    if( pIdx
     && !db->mallocFailed
    ){
      if( pWInfo->eOnePass==ONEPASS_OFF || !HasRowid(pIdx->pTable) ){
        last = iEnd;
      }else{
        last = pWInfo->iEndWhere;
      }
      if( pIdx->bHasExpr ){
        IndexedExpr *p = pParse->pIdxEpr;
        while( p ){
          if( p->iIdxCur==pLevel->iIdxCur ){
#ifdef WHERETRACE_ENABLED
            if( sqlite3WhereTrace & 0x200 ){
              sqlite3DebugPrintf("Disable pParse->pIdxEpr term {%d,%d}\n",
                                  p->iIdxCur, p->iIdxCol);
              if( sqlite3WhereTrace & 0x5000 ) sqlite3ShowExpr(p->pExpr);
            }
#endif
            p->iDataCur = -1;
            p->iIdxCur = -1;
          }
          p = p->pIENext;
        }
      }
      k = pLevel->addrBody + 1;
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ){
        printf("TRANSLATE cursor %d->%d in opcode range %d..%d\n",
                pLevel->iTabCur, pLevel->iIdxCur, k, last-1);
      }
      /* Proof that the "+1" on the k value above is safe */
      pOp = sqlite3VdbeGetOp(v, k - 1);
      assert( pOp->opcode!=OP_Column || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_Rowid  || pOp->p1!=pLevel->iTabCur );
      assert( pOp->opcode!=OP_IfNullRow || pOp->p1!=pLevel->iTabCur );
#endif
      pOp = sqlite3VdbeGetOp(v, k);
      pLastOp = pOp + (last - k);
      assert( pOp<=pLastOp );
      do{
        if( pOp->p1!=pLevel->iTabCur ){
          /* no-op */
        }else if( pOp->opcode==OP_Column
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
         || pOp->opcode==OP_Offset
#endif
        ){
          int x = pOp->p2;
          assert( pIdx->pTable==pTab );
#ifdef SQLITE_ENABLE_OFFSET_SQL_FUNC
          if( pOp->opcode==OP_Offset ){
            /* Do not need to translate the column number */
          }else
#endif
          if( !HasRowid(pTab) ){
            Index *pPk = sqlite3PrimaryKeyIndex(pTab);
            x = pPk->aiColumn[x];
            assert( x>=0 );
          }else{
            testcase( x!=sqlite3StorageColumnToTable(pTab,x) );
            x = sqlite3StorageColumnToTable(pTab,x);
          }
          x = sqlite3TableColumnToIndex(pIdx, x);
          if( x>=0 ){
            pOp->p2 = x;
            pOp->p1 = pLevel->iIdxCur;
            OpcodeRewriteTrace(db, k, pOp);
          }else if( pLoop->wsFlags & (WHERE_IDX_ONLY|WHERE_EXPRIDX) ){
            if( pLoop->wsFlags & WHERE_IDX_ONLY ){
              /* An error. pLoop is supposed to be a covering index loop,
              ** and yet the VM code refers to a column of the table that
              ** is not part of the index.  */
              sqlite3ErrorMsg(pParse, "internal query planner error");
              pParse->rc = SQLITE_INTERNAL;
            }else{
              /* The WHERE_EXPRIDX flag is set by the planner when it is likely
              ** that pLoop is a covering index loop, but it is not possible
              ** to be 100% sure. In this case, any OP_Explain opcode
              ** corresponding to this loop describes the index as a "COVERING
              ** INDEX". But, pOp proves that pLoop is not actually a covering
              ** index loop. So clear the WHERE_EXPRIDX flag and rewrite the
              ** text that accompanies the OP_Explain opcode, if any.  */
              pLoop->wsFlags &= ~WHERE_EXPRIDX;
              sqlite3WhereAddExplainText(pParse,
                  pLevel->addrBody-1,
                  pTabList,
                  pLevel,
                  pWInfo->wctrlFlags
              );
            }
          }
        }else if( pOp->opcode==OP_Rowid ){
          pOp->p1 = pLevel->iIdxCur;
          pOp->opcode = OP_IdxRowid;
          OpcodeRewriteTrace(db, k, pOp);
        }else if( pOp->opcode==OP_IfNullRow ){
          pOp->p1 = pLevel->iIdxCur;
          OpcodeRewriteTrace(db, k, pOp);
        }
#ifdef SQLITE_DEBUG
        k++;
#endif
      }while( (++pOp)<pLastOp );
#ifdef SQLITE_DEBUG
      if( db->flags & SQLITE_VdbeAddopTrace ) printf("TRANSLATE complete\n");
#endif
    }
  }

  /* The "break" point is here, just past the end of the outer loop.
  ** Set it.
  */
  sqlite3VdbeResolveLabel(v, pWInfo->iBreak);

  /* Final cleanup
  */
  pParse->nQueryLoop = pWInfo->savedNQueryLoop;
  whereInfoFree(db, pWInfo);
  pParse->withinRJSubrtn -= nRJ;
  return;
}